

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int memCmpRev(void *buf1,void *buf2,size_t count)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((count & 7) == 0) {
    bVar6 = false;
    bVar1 = false;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    uVar3 = count - 1;
    do {
      count = uVar3;
      uVar5 = (ulong)*(byte *)((long)buf1 + count) | uVar5 << 8;
      uVar4 = (ulong)*(byte *)((long)buf2 + count) | uVar4 << 8;
      uVar3 = count - 1;
    } while ((count & 7) != 0);
    bVar6 = uVar5 < uVar4;
    bVar1 = uVar4 < uVar5 && !bVar6;
  }
  if (7 < count) {
    uVar3 = count >> 3;
    do {
      uVar4 = *(ulong *)((long)buf1 + uVar3 * 8 + -8);
      uVar5 = *(ulong *)((long)buf2 + uVar3 * 8 + -8);
      bVar2 = ~bVar1 & 1;
      if (uVar5 <= uVar4) {
        bVar2 = 0;
      }
      bVar6 = (bool)(bVar6 | bVar2);
      bVar2 = ~bVar6 & 1;
      if (uVar4 <= uVar5) {
        bVar2 = 0;
      }
      bVar1 = (bool)(bVar1 | bVar2);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return -(uint)bVar6 | (uint)bVar1;
}

Assistant:

int SAFE(memCmpRev)(const void* buf1, const void* buf2, size_t count)
{
	register word less = 0;
	register word greater = 0;
	register word w1;
	register word w2;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	if (count % O_PER_W)
	{
		w1 = w2 = 0;
		while (count % O_PER_W)
		{
			w1 = w1 << 8 | ((const octet*)buf1)[--count];
			w2 = w2 << 8 | ((const octet*)buf2)[count];
		}
		less |= ~greater & wordLess01(w1, w2);
		greater |= ~less & wordGreater01(w1, w2);
	}
	count /= O_PER_W;
	while (count--)
	{
		w1 = ((const word*)buf1)[count];
		w2 = ((const word*)buf2)[count];
#if (OCTET_ORDER == BIG_ENDIAN)
		w1 = wordRev(w1);
		w2 = wordRev(w2);
#endif
		less |= ~greater & wordLess(w1, w2);
		greater |= ~less & wordGreater(w1, w2);
	}
	w1 = w2 = 0;
	return (wordEq(less, 0) - 1) | wordNeq(greater, 0);
}